

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpx_helper.c
# Opt level: O0

uint64_t lookup_bte64(CPUX86State *env,uint64_t base,uintptr_t ra)

{
  uint64_t uVar1;
  uint64_t uVar2;
  ulong ptr;
  uint64_t bt;
  uint64_t bde;
  uint64_t bndcsr;
  uintptr_t ra_local;
  uint64_t base_local;
  CPUX86State *env_local;
  
  if ((env->hflags & 3) == 3) {
    bde = (env->bndcs_regs).cfgu;
  }
  else {
    bde = env->msr_bndcfgs;
  }
  uVar1 = extract64(base,0x14,0x1c);
  uVar2 = extract64(bde,0x14,0x2c);
  ptr = uVar1 * 8 + uVar2 * 0x1000;
  uVar1 = cpu_ldq_data_ra_x86_64(env,ptr,ra);
  if ((uVar1 & 1) == 0) {
    (env->bndcs_regs).sts = ptr | 2;
    raise_exception_ra_x86_64(env,5,ra);
  }
  uVar2 = extract64(base,3,0x11);
  return uVar2 * 0x20 + (uVar1 & 0xfffffffffffffff8);
}

Assistant:

static uint64_t lookup_bte64(CPUX86State *env, uint64_t base, uintptr_t ra)
{
    uint64_t bndcsr, bde, bt;

    if ((env->hflags & HF_CPL_MASK) == 3) {
        bndcsr = env->bndcs_regs.cfgu;
    } else {
        bndcsr = env->msr_bndcfgs;
    }

    bde = (extract64(base, 20, 28) << 3) + (extract64(bndcsr, 20, 44) << 12);
    bt = cpu_ldq_data_ra(env, bde, ra);
    if ((bt & 1) == 0) {
        env->bndcs_regs.sts = bde | 2;
        raise_exception_ra(env, EXCP05_BOUND, ra);
    }

    return (extract64(base, 3, 17) << 5) + (bt & ~7);
}